

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status fdb_iterator_prev(fdb_iterator *iterator)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_char> *paVar2;
  uint64_t *value_buf;
  wal_item_action wVar3;
  docio_handle *handle;
  snap_handle *shandle;
  size_t *keylen;
  char cVar4;
  btree_result bVar5;
  fdb_status fVar6;
  int iVar7;
  wal_item *pwVar8;
  int64_t iVar9;
  byte bVar10;
  byte bVar11;
  hbtrie_result hVar12;
  fdb_status fVar13;
  ulong uVar14;
  void *key_buf;
  size_t sVar15;
  bool bVar16;
  uint64_t offset;
  uint64_t hboffset;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  size_t seq_kv_len;
  uint64_t local_150;
  ulong local_148;
  uint64_t local_140;
  docio_object local_138;
  docio_handle *local_100;
  ulong local_f8;
  size_t *local_f0;
  uint64_t local_e8;
  fdb_kvs_id_t local_e0;
  fdb_doc local_d8;
  docio_object local_88;
  undefined1 local_48 [8];
  ulong local_40;
  size_t local_38;
  
  fVar13 = FDB_RESULT_INVALID_HANDLE;
  if ((iterator != (fdb_iterator *)0x0) && (iterator->handle != (fdb_kvs_handle *)0x0)) {
    paVar2 = &iterator->handle->handle_busy;
    LOCK();
    bVar16 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\0';
    if (bVar16) {
      (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x01';
    }
    UNLOCK();
    fVar13 = FDB_RESULT_HANDLE_BUSY;
    if (bVar16) {
      if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
LAB_0012e3f8:
        local_150 = 0xffffffffffffffff;
        local_138.length.keylen = 0;
        local_138.length.metalen = 0;
        local_138.length.bodylen = 0;
        local_138.length.bodylen_ondisk = 0;
        local_138.length.flag = '\0';
        local_138.length.checksum = '\0';
        local_138.length.reserved = 0;
        local_138.timestamp = 0;
        local_138.meta = (void *)0x0;
        local_138.body = (void *)0x0;
        local_138.key = (void *)0x0;
        local_138.field_3.seqnum = 0;
        if (iterator->direction != '\x02') {
          if (iterator->status == '\0') {
            iterator->_offset = 0xffffffffffffffff;
          }
          pwVar8 = iterator->tree_cursor_prev;
          if ((pwVar8 != (wal_item *)0x0) && (iterator->tree_cursor != pwVar8)) {
            pwVar8 = wal_itr_search_smaller(iterator->wal_itr,pwVar8);
            iterator->tree_cursor = pwVar8;
            iterator->status = '\0';
          }
        }
        bVar11 = 1;
        bVar16 = false;
LAB_0012e45a:
        do {
          local_148 = iterator->_seqnum;
          handle = iterator->handle->dhandle;
          if ((iterator->_offset == 0xffffffffffffffff) ||
             (iterator->tree_cursor == (wal_item *)0x0)) {
            if (iterator->handle->kvs == (kvs_info *)0x0) {
              bVar5 = btree_prev(iterator->seqtree_iterator,&local_148,&local_150);
              bVar16 = bVar5 == BTREE_RESULT_SUCCESS;
LAB_0012e5b0:
              btreeblk_end(iterator->handle->bhandle);
              if (!bVar16) goto LAB_0012e89d;
              local_148 = local_148 >> 0x38 | (local_148 & 0xff000000000000) >> 0x28 |
                          (local_148 & 0xff0000000000) >> 0x18 | (local_148 & 0xff00000000) >> 8 |
                          (local_148 & 0xff000000) << 8 | (local_148 & 0xff0000) << 0x18 |
                          (local_148 & 0xff00) << 0x28 | local_148 << 0x38;
              iterator->_seqnum = local_148;
              if ((iterator->field_10).start_seqnum <= local_148) {
                local_150 = local_150 >> 0x38 | (local_150 & 0xff000000000000) >> 0x28 |
                            (local_150 & 0xff0000000000) >> 0x18 | (local_150 & 0xff00000000) >> 8 |
                            (local_150 & 0xff000000) << 8 | (local_150 & 0xff0000) << 0x18 |
                            (local_150 & 0xff00) << 0x28 | local_150 << 0x38;
                iterator->status = '\0';
                bVar16 = true;
                goto LAB_0012e5f4;
              }
            }
            else {
              hVar12 = hbtrie_prev(iterator->seqtrie_iterator,local_48,&local_38,&local_150);
              if (hVar12 == HBTRIE_RESULT_SUCCESS) {
                buf2kvid(8,local_48,&local_e0);
                bVar16 = local_e0 == iterator->handle->kvs->id;
                local_148 = local_40;
                goto LAB_0012e5b0;
              }
              btreeblk_end(iterator->handle->bhandle);
LAB_0012e89d:
              iterator->_offset = 0xffffffffffffffff;
            }
            fVar13 = FDB_RESULT_ITERATOR_FAIL;
            goto LAB_0012e8ad;
          }
          do {
            if (iterator->tree_cursor == (wal_item *)0x0) goto LAB_0012e5f4;
            if (iterator->status == '\x01') {
              iterator->tree_cursor_prev = iterator->tree_cursor;
              pwVar8 = wal_itr_prev(iterator->wal_itr);
              iterator->tree_cursor = pwVar8;
              if (pwVar8 == (wal_item *)0x0) goto LAB_0012e45a;
            }
            iterator->status = '\x01';
            pwVar8 = iterator->tree_cursor;
            if (pwVar8->action == '\x01') {
              bVar10 = ((byte)iterator->opt & 2) >> 1;
            }
            else {
              bVar10 = 0;
            }
            if (((iterator->opt & 1) == 0) && (pwVar8->action == '\x02' || bVar10 != 0)) {
              bVar10 = pwVar8 == (wal_item *)0x0 & bVar11;
              cVar4 = (bVar10 ^ 1) * '\x02' + '\x01';
              if (bVar10 != 0) {
                fVar13 = FDB_RESULT_ITERATOR_FAIL;
              }
            }
            else {
              local_150 = pwVar8->offset;
              iterator->_offset = local_150;
              iterator->_seqnum = pwVar8->seqnum;
              cVar4 = '\x04';
            }
          } while (cVar4 == '\x03');
          if (cVar4 != '\x04') goto LAB_0012e8ad;
LAB_0012e5f4:
          if ((!bVar16) || ((iterator->opt & 1) != 0)) goto LAB_0012e87a;
          local_138.key = (void *)0x0;
          local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
          local_138.meta = (void *)0x0;
          local_138.body = (void *)0x0;
          local_e8 = docio_read_doc_key_meta(handle,local_150,&local_138,true);
          if ((long)local_e8 < 1) {
            fVar13 = (fdb_status)local_e8;
            if (local_e8 == 0) {
              fVar13 = FDB_RESULT_KEY_NOT_FOUND;
            }
            iVar7 = 1;
          }
          else if (((local_138.length._8_8_ & 0x400000000) == 0) || ((iterator->opt & 2) == 0)) {
            local_d8.key = local_138.key;
            local_d8.keylen = local_138.length._0_8_ & 0xffff;
            local_d8.seqnum = 0xffffffffffffffff;
            shandle = iterator->handle->shandle;
            fVar6 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,
                             &local_d8,&local_e8);
            if ((fVar6 == FDB_RESULT_SUCCESS) &&
               (((void *)(iterator->field_10).start_seqnum <= local_d8.seqnum &&
                (local_d8.seqnum <= (void *)(iterator->field_12).end_seqnum)))) {
              free(local_138.key);
              free(local_138.meta);
              iVar7 = 2;
            }
            else {
              local_88.length.keylen = 0;
              local_88.length.metalen = 0;
              local_88.length.bodylen = 0;
              local_88.length.bodylen_ondisk = 0;
              local_88.length.flag = '\0';
              local_88.length.checksum = '\0';
              local_88.length.reserved = 0;
              local_88.timestamp = 0;
              local_88.meta = (void *)0x0;
              local_88.body = (void *)0x0;
              local_88.key = (void *)0x0;
              local_88.field_3.seqnum = 0;
              hVar12 = hbtrie_find(iterator->handle->trie,local_138.key,
                                   (uint)local_138.length.keylen,&local_f8);
              btreeblk_end(iterator->handle->bhandle);
              iVar7 = 2;
              if (hVar12 == HBTRIE_RESULT_SUCCESS) {
                local_88.key = local_138.key;
                local_f8 = local_f8 >> 0x38 | (local_f8 & 0xff000000000000) >> 0x28 |
                           (local_f8 & 0xff0000000000) >> 0x18 | (local_f8 & 0xff00000000) >> 8 |
                           (local_f8 & 0xff000000) << 8 | (local_f8 & 0xff0000) << 0x18 |
                           (local_f8 & 0xff00) << 0x28 | local_f8 << 0x38;
                local_88.meta = (void *)0x0;
                iVar9 = docio_read_doc_key_meta(iterator->handle->dhandle,local_f8,&local_88,true);
                if (iVar9 < 1) {
                  free(local_138.key);
                  free(local_138.meta);
                  fVar13 = (fdb_status)iVar9;
                  if (iVar9 == 0) {
                    fVar13 = FDB_RESULT_KEY_NOT_FOUND;
                  }
                  iVar7 = 1;
                  bVar16 = false;
                }
                else if ((local_138.field_3.seqnum < local_88.field_3.seqnum) &&
                        ((ulong)local_88.field_3 <= (iterator->field_12).end_seqnum)) {
                  free(local_138.key);
                  free(local_138.meta);
                  free(local_88.meta);
                  iVar7 = 2;
                  bVar16 = false;
                }
                else {
                  free(local_88.meta);
                  iVar7 = 0;
                  bVar16 = true;
                }
                if (!bVar16) goto LAB_0012e865;
                iVar7 = 0;
              }
              free(local_138.key);
              free(local_138.meta);
            }
          }
          else {
            free(local_138.key);
            free(local_138.meta);
            fVar13 = FDB_RESULT_KEY_NOT_FOUND;
            iVar7 = 1;
          }
LAB_0012e865:
          bVar16 = true;
          bVar11 = 0;
          if (iVar7 != 2) goto code_r0x0012e875;
        } while( true );
      }
      if (iterator->direction != '\x02') {
        iterator->_offset = 0xffffffffffffffff;
        if (iterator->tree_cursor == (wal_item *)0x0) {
          if (iterator->tree_cursor_prev != (wal_item *)0x0) {
            pwVar8 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor_prev);
            iterator->tree_cursor = pwVar8;
            iterator->status = '\0';
          }
        }
        else {
          pwVar8 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor);
          iterator->tree_cursor = pwVar8;
          if ((iterator->direction == '\x01') && (iterator->status != '\x01')) {
            pwVar8 = wal_itr_prev(iterator->wal_itr);
            iterator->tree_cursor = pwVar8;
          }
        }
      }
      value_buf = &iterator->_offset;
      local_f0 = &iterator->_keylen;
      hVar12 = HBTRIE_RESULT_SUCCESS;
LAB_0012e8e7:
      do {
        do {
          keylen = local_f0;
          key_buf = iterator->_key;
          local_100 = iterator->handle->dhandle;
          if (iterator->_offset == 0xffffffffffffffff) {
            local_d8.keylen = 0;
            local_d8.metalen = 0;
            local_d8.bodylen = local_d8.bodylen & 0xffffffff00000000;
            local_d8.seqnum = 0;
            local_d8.offset = 0;
            local_d8.size_ondisk = 0;
            local_d8.key = (void *)0x0;
            do {
              do {
                hVar12 = hbtrie_prev(iterator->hbtrie_iterator,key_buf,keylen,value_buf);
                btreeblk_end(iterator->handle->bhandle);
                uVar14 = iterator->_offset;
                uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                         (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                         (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                         (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                iterator->_offset = uVar14;
                if (((iterator->opt & 2) == 0) || (hVar12 != HBTRIE_RESULT_SUCCESS))
                goto LAB_0012e90a;
                local_d8.key = (void *)0x0;
                local_d8.seqnum = 0;
                local_d8.bodylen = 0;
                local_d8.size_ondisk = 0;
                local_d8.keylen = 0;
                local_d8.metalen = 0;
                local_d8.offset = 0;
                iVar9 = docio_read_doc_key_meta(local_100,uVar14,(docio_object *)&local_d8,true);
                sVar15 = local_d8.metalen;
              } while (iVar9 < 1);
              free((void *)local_d8.size_ondisk);
              free((void *)local_d8.seqnum);
            } while ((sVar15 & 0x400000000) != 0);
          }
LAB_0012e90a:
          if (hVar12 == HBTRIE_RESULT_INDEX_CORRUPTED) {
            fVar13 = FDB_RESULT_FILE_CORRUPTION;
            goto LAB_0012eb81;
          }
          sVar15 = *keylen;
          local_140 = *value_buf;
          if ((hVar12 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0))
          goto LAB_0012eb75;
          do {
            if (iterator->tree_cursor == (wal_item *)0x0) goto LAB_0012eae6;
            if (iterator->status == '\x01') {
              iterator->tree_cursor_prev = iterator->tree_cursor;
              pwVar8 = wal_itr_prev(iterator->wal_itr);
              iterator->tree_cursor = pwVar8;
            }
            pwVar8 = iterator->tree_cursor;
            if (pwVar8 == (wal_item *)0x0) {
              if (hVar12 != HBTRIE_RESULT_SUCCESS) goto LAB_0012eb75;
              goto LAB_0012eae6;
            }
            iVar7 = 1;
            if (hVar12 == HBTRIE_RESULT_SUCCESS) {
              iVar7 = _fdb_key_cmp(iterator,pwVar8->header->key,(ulong)pwVar8->header->keylen,
                                   key_buf,sVar15);
            }
            if (iVar7 < 0) goto LAB_0012eae6;
            wVar3 = pwVar8->action;
            if (wVar3 == '\x01') {
              bVar11 = ((byte)iterator->opt & 2) >> 1;
            }
            else {
              bVar11 = 0;
            }
            iterator->status = '\x01';
            if (iVar7 == 0) {
              *value_buf = 0xffffffffffffffff;
              iVar7 = 2;
            }
            else {
              iVar7 = 5;
            }
            if (wVar3 != '\x02' && bVar11 == 0) {
              local_140 = pwVar8->offset;
              key_buf = pwVar8->header->key;
              sVar15 = (size_t)pwVar8->header->keylen;
              iVar7 = 0;
            }
          } while (iVar7 == 5);
        } while (iVar7 == 2);
LAB_0012eae6:
        if (local_140 == *value_buf) {
          iterator->_offset = 0xffffffffffffffff;
          iterator->status = '\0';
        }
        if (iterator->start_key != (void *)0x0) {
          iVar7 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,
                               key_buf,sVar15);
          if (iVar7 == 0) {
            if ((iterator->opt & 4) != 0) goto LAB_0012eb75;
          }
          else if (0 < iVar7) {
LAB_0012eb75:
            fVar13 = FDB_RESULT_ITERATOR_FAIL;
            goto LAB_0012eb81;
          }
        }
        if (iterator->end_key == (void *)0x0) break;
        iVar7 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,key_buf,
                             sVar15);
        if (iVar7 == 0) {
          if ((iterator->opt & 8) == 0) break;
          goto LAB_0012e8e7;
        }
      } while (iVar7 < 0);
      iterator->_dhandle = local_100;
      iterator->_get_offset = local_140;
      fVar13 = FDB_RESULT_SUCCESS;
LAB_0012eb81:
      if (fVar13 == FDB_RESULT_SUCCESS) {
        iterator->direction = '\x02';
      }
      else {
        iterator->_dhandle = (docio_handle *)0x0;
        if ((iterator->direction != '\0') &&
           (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
             (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0')))
           ) {
          iterator->_offset = 0xffffffffffffffff;
        }
      }
      paVar2 = &iterator->handle->handle_busy;
      LOCK();
      if ((paVar2->super___atomic_base<unsigned_char>)._M_i == '\x01') {
        (paVar2->super___atomic_base<unsigned_char>)._M_i = '\0';
      }
      UNLOCK();
      LOCK();
      paVar1 = &iterator->handle->op_stats->num_iterator_moves;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
  }
  return fVar13;
code_r0x0012e875:
  if (iVar7 == 0) {
LAB_0012e87a:
    iterator->_dhandle = handle;
    iterator->_get_offset = local_150;
    fVar13 = FDB_RESULT_SUCCESS;
  }
LAB_0012e8ad:
  if (fVar13 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0012eb81;
  goto LAB_0012e3f8;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_prev(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_REVERSE;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_PREV);
    return result;
}